

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockPluginTest.cpp
# Opt level: O0

void __thiscall
TEST_MockPlugin_checkExpectationsWorksAlsoWithHierachicalObjects_TestShell::
~TEST_MockPlugin_checkExpectationsWorksAlsoWithHierachicalObjects_TestShell
          (TEST_MockPlugin_checkExpectationsWorksAlsoWithHierachicalObjects_TestShell *this)

{
  TEST_MockPlugin_checkExpectationsWorksAlsoWithHierachicalObjects_TestShell *this_local;
  
  ~TEST_MockPlugin_checkExpectationsWorksAlsoWithHierachicalObjects_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockPlugin, checkExpectationsWorksAlsoWithHierachicalObjects)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("differentScope::foobar")->onObject((void*) 1);
    MockExpectedObjectDidntHappenFailure expectedFailure(test, "differentScope::foobar", expectations);

    mock("differentScope").expectOneCall("foobar").onObject((void*) 1);
    mock("differentScope").actualCall("foobar");

    plugin.postTestAction(*test, *result);

    STRCMP_CONTAINS(expectedFailure.getMessage().asCharString(), output.getOutput().asCharString());
    CHECK_NO_MOCK_FAILURE();
}